

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slcanpty.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  uint __fd;
  char *pcVar6;
  ssize_t sVar7;
  size_t sVar8;
  uint uVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined8 *__optval;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  socklen_t __optlen;
  byte *pbVar16;
  uint uVar17;
  bool bVar18;
  char replybuf [10];
  char buf [33];
  can_filter fi;
  fd_set rdfs;
  sockaddr_can addr;
  char local_1c8;
  undefined2 uStack_1c7;
  byte bStack_1c5;
  byte local_1c4;
  undefined2 uStack_1c3;
  byte abStack_1c0 [12];
  uint local_1b4;
  long local_1b0;
  uint local_1a4;
  uint local_1a0;
  undefined4 local_19c;
  size_t local_198;
  int local_18c;
  uint local_188;
  undefined1 local_184;
  byte local_180 [40];
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  undefined8 local_130;
  long local_128;
  long local_120;
  fd_set local_118;
  sockaddr local_90;
  termios local_78;
  
  if (argc != 3) {
    main_cold_1();
    return 1;
  }
  local_118.fds_bits[1] = 0;
  local_118.fds_bits[2] = 0;
  local_118.fds_bits[3] = 0;
  local_118.fds_bits[4] = 0;
  local_118.fds_bits[5] = 0;
  local_118.fds_bits[6] = 0;
  local_118.fds_bits[7] = 0;
  local_118.fds_bits[8] = 0;
  local_118.fds_bits[9] = 0;
  local_118.fds_bits[10] = 0;
  local_118.fds_bits[0xb] = 0;
  local_118.fds_bits[0xc] = 0;
  local_118.fds_bits[0xd] = 0;
  local_118.fds_bits[0xe] = 0;
  local_118.fds_bits[0xf] = 0;
  local_118.fds_bits[0] = 1;
  local_78.c_iflag = 0;
  local_78.c_oflag = 0;
  local_78.c_cflag = 0;
  local_78.c_lflag = 0;
  uVar10 = 0;
  iVar4 = select(1,&local_118,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&local_78);
  local_19c = (undefined4)CONCAT71((int7)((ulong)uVar10 >> 8),1);
  if ((-1 < iVar4) && ((iVar4 == 0 || (iVar4 = getchar(), iVar4 != -1)))) {
    local_19c = 0;
  }
  uVar5 = open(argv[1],2);
  if ((int)uVar5 < 0) {
    pcVar6 = "open pty";
  }
  else {
    iVar4 = tcgetattr(uVar5,&local_78);
    if (iVar4 == 0) {
      local_78._8_8_ = local_78._8_8_ & 0xfffff385ffffffff;
      local_78._0_8_ = local_78._0_8_ & 0xfffffffffffffebf | 0x40;
      tcsetattr(uVar5,0,&local_78);
      iVar4 = strcmp(argv[1],"/dev/ptmx");
      if (iVar4 == 0) {
        iVar4 = grantpt(uVar5);
        if (iVar4 < 0) {
          pcVar6 = "grantpt";
          goto LAB_00101c7f;
        }
        iVar4 = unlockpt(uVar5);
        if (iVar4 < 0) {
          pcVar6 = "unlockpt";
          goto LAB_00101c7f;
        }
        pcVar6 = ptsname(uVar5);
        if (pcVar6 == (char *)0x0) {
          pcVar6 = "ptsname";
          goto LAB_00101c7f;
        }
        printf("open: %s: slave pseudo-terminal is %s\n",argv[1],pcVar6);
      }
      __fd = socket(0x1d,3,1);
      if ((int)__fd < 0) {
        pcVar6 = "socket";
      }
      else {
        local_90.sa_family = 0x1d;
        local_90.sa_data._2_4_ = if_nametoindex(argv[2]);
        if (local_90.sa_data._2_4_ == 0) {
          pcVar6 = "if_nametoindex";
          goto LAB_00101c7f;
        }
        setsockopt(__fd,0x65,1,(void *)0x0,0);
        iVar4 = bind(__fd,&local_90,0x18);
        if (-1 < iVar4) {
          local_130 = 0;
          local_140 = 1L << ((byte)uVar5 & 0x3f);
          local_150 = 1L << ((byte)__fd & 0x3f);
          local_148 = (ulong)(uVar5 >> 6);
          local_158 = (ulong)(__fd >> 6);
          local_18c = __fd + 1;
          local_1a0 = 0;
          local_1b4 = uVar5;
          do {
            do {
              local_118.fds_bits[0xe] = 0;
              local_118.fds_bits[0xf] = 0;
              local_118.fds_bits[0xc] = 0;
              local_118.fds_bits[0xd] = 0;
              local_118.fds_bits[10] = 0;
              local_118.fds_bits[0xb] = 0;
              local_118.fds_bits[8] = 0;
              local_118.fds_bits[9] = 0;
              local_118.fds_bits[6] = 0;
              local_118.fds_bits[7] = 0;
              local_118.fds_bits[4] = 0;
              local_118.fds_bits[5] = 0;
              local_118.fds_bits[2] = 0;
              local_118.fds_bits[3] = 0;
              local_118.fds_bits[0] = 0;
              local_118.fds_bits[1] = 0;
              if ((char)local_19c == '\0') {
                local_118.fds_bits[0] = 1;
              }
              local_118.fds_bits[0] = (__fd_mask)((char)local_19c == '\0');
              local_118.fds_bits[local_148] = local_118.fds_bits[local_148] | local_140;
              local_118.fds_bits[local_158] = local_118.fds_bits[local_158] | local_150;
              iVar4 = select(local_18c,&local_118,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
              if (iVar4 < 0) {
                pcVar6 = "select";
                goto LAB_00101c7f;
              }
              if ((local_118.fds_bits[0] & 1U) != 0) goto LAB_00101ca9;
              uVar9 = pty2can_rxoffset;
              if ((local_118.fds_bits[local_148] & local_140) != 0) {
                sVar7 = read(uVar5,&pty2can_buf + pty2can_rxoffset,199 - (ulong)pty2can_rxoffset);
                iVar4 = (int)sVar7;
                if (0 < iVar4) {
                  uVar14 = iVar4 + pty2can_rxoffset;
                  pty2can_rxoffset = 0;
LAB_00101661:
                  uVar15 = (ulong)uVar14;
                  uVar17 = (uint)pty2can_buf;
                  if ((pty2can_buf == 0xd) && (sVar8 = uVar15, uVar14 != 0)) {
                    do {
                      memmove(&pty2can_buf,&DAT_001061a1,sVar8);
                      uVar15 = sVar8 - 1;
                      uVar17 = (uint)pty2can_buf;
                      if ((int)sVar8 == 1) break;
                      sVar8 = uVar15;
                    } while (pty2can_buf == 0xd);
                  }
                  uVar14 = (uint)uVar15;
                  uVar9 = pty2can_rxoffset;
                  if (uVar14 == 0) goto LAB_00101a2c;
                  uVar11 = 0;
                  while (uVar9 = uVar14, (&pty2can_buf)[uVar11] != '\r') {
                    uVar11 = uVar11 + 1;
                    if ((uVar15 & 0xffffffff) == uVar11) goto LAB_00101a2c;
                  }
                  if (uVar14 == (uint)uVar11) goto LAB_00101a2c;
                  (&pty2can_buf)[uVar15 & 0xffffffff] = 0;
                  if (((byte)uVar17 & 0xdf) == 0x4d) {
                    DAT_001061a9 = 0;
                    uVar13 = 9;
                    goto LAB_001019b5;
                  }
                  uVar13 = 2;
                  switch(uVar17) {
                  case 0x41:
                  case 0x50:
                    uVar13 = 1;
                    break;
                  case 0x42:
                  case 0x44:
                  case 0x45:
                  case 0x47:
                  case 0x48:
                  case 0x49:
                  case 0x4a:
                  case 0x4b:
                  case 0x4c:
                  case 0x4d:
                  case 0x51:
                  case 0x57:
                  case 0x59:
                    goto switchD_00101704_caseD_42;
                  case 0x43:
                    __optval = (undefined8 *)0x0;
                    __optlen = 0;
                    goto LAB_001018f8;
                  case 0x46:
                    local_1c4 = 0;
                    local_1c8 = 'F';
                    uStack_1c7 = 0x3030;
                    bStack_1c5 = 0xd;
                    goto LAB_0010195d;
                  case 0x4e:
                    local_1c4 = 0x32;
                    uStack_1c3 = 0xd;
                    local_1c8 = 'N';
                    uStack_1c7 = 0x3234;
                    bStack_1c5 = 0x34;
                    goto LAB_0010195d;
                  case 0x4f:
                    __optval = &local_130;
                    __optlen = 8;
LAB_001018f8:
                    uVar13 = 1;
                    setsockopt(__fd,0x65,1,__optval,__optlen);
LAB_001019b5:
                    local_1c8 = '\r';
                    goto LAB_001019ba;
                  case 0x52:
                  case 0x54:
switchD_00101704_caseD_52:
                    bVar18 = (uVar17 & 0x20) == 0;
                    iVar4 = (uint)bVar18 * 5;
                    uVar13 = iVar4 + 4;
                    uVar15 = (ulong)((uint)bVar18 * 5);
                    local_180[0] = 0;
                    local_180[1] = 0;
                    local_180[2] = 0;
                    local_180[3] = 0;
                    local_180[4] = 0;
                    local_180[5] = 0;
                    local_180[6] = 0;
                    local_180[7] = 0;
                    cVar3 = (&DAT_001061a4)[uVar15];
                    if ((uVar17 & 0x56) == 0x52) {
                      if (cVar3 == '0') {
                        uVar9 = 0;
                        goto LAB_00101770;
                      }
                      (&DAT_001061a4)[uVar15] = 0;
                      local_1b0 = uVar15 + 4;
                      uVar15 = strtoul((char *)&DAT_001061a1,(char **)0x0,0x10);
                      local_188 = (uVar17 & 0x20) * 0x4000000 + 0xc0000000 | (uint)uVar15;
                      (&pty2can_buf)[local_1b0] = cVar3;
                      local_184 = 0;
                      uVar13 = iVar4 + 3;
                    }
                    else {
                      uVar9 = (uint)(byte)(cVar3 - 0x30U);
                      if (8 < (byte)(cVar3 - 0x30U)) break;
LAB_00101770:
                      local_184 = (undefined1)uVar9;
                      (&DAT_001061a4)[uVar15] = 0;
                      local_1b0 = uVar15 + 4;
                      local_1a4 = uVar9;
                      uVar15 = strtoul((char *)&DAT_001061a1,(char **)0x0,0x10);
                      uVar9 = (uint)uVar15 | 0x80000000;
                      if ((uVar17 & 0x20) != 0) {
                        uVar9 = (uint)uVar15;
                      }
                      local_188 = uVar9 | 0x40000000;
                      if ((uVar17 & 0x56) != 0x52) {
                        local_188 = uVar9;
                      }
                      if ((char)local_1a4 == '\0') {
                        cVar3 = '\0';
                      }
                      else {
                        local_198 = local_1b0 + 0x1061a2;
                        local_138 = (ulong)((local_1a4 & 0xff) * 2);
                        pbVar16 = local_180;
                        uVar15 = 0;
                        do {
                          sVar8 = local_198;
                          bVar1 = asc2nibble(*(char *)((local_198 - 1) + uVar15));
                          if (0xf < bVar1) {
                            uVar13 = (int)local_1b0 + (int)uVar15 + 2;
                            uVar5 = local_1b4;
                            goto LAB_00101987;
                          }
                          *pbVar16 = bVar1 << 4;
                          bVar2 = asc2nibble(*(char *)(sVar8 + uVar15));
                          uVar5 = local_1b4;
                          if (0xf < bVar2) {
                            uVar13 = (int)local_1b0 + (int)uVar15 + 3;
                            goto LAB_00101987;
                          }
                          *pbVar16 = bVar2 | bVar1 << 4;
                          uVar15 = uVar15 + 2;
                          pbVar16 = pbVar16 + 1;
                        } while (local_138 != uVar15);
                        uVar13 = (int)local_1b0 + (int)uVar15;
                        cVar3 = (char)local_1a4;
                      }
                      uVar13 = uVar13 + (cVar3 == '\0');
                    }
                    sVar7 = write(__fd,&local_188,0x10);
                    if ((int)sVar7 == 0x10) goto LAB_001019b5;
                    pcVar6 = "write socket";
                    goto LAB_00101ca4;
                  case 0x53:
                  case 0x55:
                    goto switchD_00101704_caseD_53;
                  case 0x56:
                    local_1c4 = 0x33;
                    uStack_1c3 = 0xd;
                    local_1c8 = 'V';
                    uStack_1c7 = 0x3031;
                    bStack_1c5 = 0x31;
LAB_0010195d:
                    sVar8 = strlen(&local_1c8);
                    uVar9 = (uint)sVar8;
                    uVar13 = 1;
                    goto LAB_001019bf;
                  case 0x58:
                    uVar13 = 2;
                    if ((DAT_001061a1 & 1) != 0) goto switchD_00101704_caseD_53;
                    break;
                  case 0x5a:
                    local_1a0 = DAT_001061a1 & 1;
                    goto switchD_00101704_caseD_53;
                  default:
                    switch(uVar17) {
                    case 0x72:
                    case 0x74:
                      goto switchD_00101704_caseD_52;
                    case 0x73:
                      uVar13 = 5;
                      goto switchD_00101704_caseD_53;
                    case 0x76:
                      local_1c4 = 0x34;
                      uStack_1c3 = 0xd;
                      local_1c8 = 'v';
                      uStack_1c7 = 0x3031;
                      bStack_1c5 = 0x31;
                      goto LAB_0010195d;
                    }
                    goto switchD_00101704_caseD_42;
                  }
                  goto LAB_00101987;
                }
                if (-1 < iVar4) goto LAB_00101ca9;
                pcVar6 = "read pty";
                goto LAB_00101ca4;
              }
LAB_00101a2c:
              pty2can_rxoffset = uVar9;
            } while ((local_118.fds_bits[local_158] & local_150) == 0);
            sVar7 = read(__fd,&local_1c8,0x10);
            bVar1 = local_1c4;
            if ((int)sVar7 != 0x10) {
              pcVar6 = "read socket";
              goto LAB_00101ca4;
            }
            uVar5 = (uint)((bStack_1c5 & 0x40) == 0) * 2 + 0x52;
            if ((char)bStack_1c5 < '\0') {
              uVar9 = CONCAT13(bStack_1c5,CONCAT21(uStack_1c7,local_1c8)) & 0x1fffffff;
              pcVar6 = "%c%08X%d";
            }
            else {
              uVar5 = uVar5 | 0x20;
              uVar9 = CONCAT21(uStack_1c7,local_1c8) & 0x7ff;
              pcVar6 = "%c%03X%d";
            }
            uVar15 = (ulong)local_1c4;
            sprintf((char *)&local_188,pcVar6,(ulong)uVar5,(ulong)uVar9);
            local_198 = strlen((char *)&local_188);
            sVar8 = local_198;
            if (bVar1 != 0) {
              pcVar6 = (char *)((long)&local_188 + (long)(int)local_198);
              uVar11 = 0;
              local_198 = sVar8;
              do {
                sprintf(pcVar6,"%02X",(ulong)abStack_1c0[uVar11]);
                uVar11 = uVar11 + 1;
                pcVar6 = pcVar6 + 2;
              } while (uVar15 != uVar11);
            }
            uVar5 = local_1b4;
            if (local_1a0 != 0) {
              iVar4 = ioctl(__fd,0x8906,&local_128);
              if (iVar4 < 0) {
                perror("SIOCGSTAMP");
              }
              sprintf((char *)((long)&local_188 + (long)(int)((int)local_198 + (uint)bVar1 * 2)),
                      "%04llX",local_120 / 1000 + (local_128 % 0x3c) * 1000);
            }
            sVar8 = strlen((char *)&local_188);
            *(undefined2 *)((long)&local_188 + sVar8) = 0xd;
            sVar8 = strlen((char *)&local_188);
            sVar7 = write(uVar5,&local_188,sVar8);
            if ((int)sVar7 < 0) {
              pcVar6 = "write pty";
LAB_00101ca4:
              perror(pcVar6);
LAB_00101ca9:
              close(uVar5);
              close(__fd);
              return 0;
            }
            fflush((FILE *)0x0);
          } while( true );
        }
        pcVar6 = "bind";
      }
      perror(pcVar6);
      return 1;
    }
    pcVar6 = "tcgetattr";
  }
LAB_00101c7f:
  perror(pcVar6);
  return 1;
switchD_00101704_caseD_53:
  goto LAB_001019b5;
switchD_00101704_caseD_42:
  uVar13 = uVar14 - 1;
LAB_00101987:
  local_1c8 = '\a';
LAB_001019ba:
  uVar9 = 1;
LAB_001019bf:
  sVar7 = write(uVar5,&local_1c8,(ulong)uVar9);
  if ((int)sVar7 < 0) {
    pcVar6 = "write pty replybuf";
    goto LAB_00101ca4;
  }
  uVar9 = pty2can_rxoffset;
  if (uVar14 <= uVar13 + 1) goto LAB_00101a2c;
  uVar14 = uVar14 + ~uVar13;
  lVar12 = 0;
  do {
    (&pty2can_buf)[lVar12] = (&pty2can_buf)[(ulong)(uVar13 + 1) + lVar12];
    lVar12 = lVar12 + 1;
  } while (uVar14 != (uint)lVar12);
  goto LAB_00101661;
}

Assistant:

int main(int argc, char **argv)
{
	fd_set rdfs;
	int p; /* pty master file */
	int s; /* can raw socket */
	struct sockaddr_can addr;
	struct termios topts;
	int select_stdin = 0;
	int running = 1;
	int tstamp = 0;
	int is_open = 0;
	struct can_filter fi;

	/* check command line options */
	if (argc != 3) {
		print_usage(basename(argv[0]));
		return 1;
	}

	select_stdin = check_select_stdin();

	/* open pty */
	p = open(argv[1], O_RDWR);
	if (p < 0) {
		perror("open pty");
		return 1;
	}

	if (tcgetattr(p, &topts)) {
		perror("tcgetattr");
		return 1;
	}

	/* disable local echo which would cause double frames */
	topts.c_lflag &= ~(ICANON | ECHO | ECHOE | ECHOK | ECHONL | ECHOPRT | ECHOKE);
	topts.c_iflag &= ~(ICRNL);
	topts.c_iflag |= INLCR;
	tcsetattr(p, TCSANOW, &topts);

	/* Support for the Unix 98 pseudo-terminal interface /dev/ptmx /dev/pts/N */
	if (strcmp(argv[1], DEVICE_NAME_PTMX) == 0) {
		char *name_pts = NULL; /* slave pseudo-terminal device name */

		if (grantpt(p) < 0) {
			perror("grantpt");
			return 1;
		}

		if (unlockpt(p) < 0) {
			perror("unlockpt");
			return 1;
		}

		name_pts = ptsname(p);
		if (name_pts == NULL) {
			perror("ptsname");
			return 1;
		}
		printf("open: %s: slave pseudo-terminal is %s\n", argv[1], name_pts);
	}

	/* open socket */
	s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
	if (s < 0) {
		perror("socket");
		return 1;
	}

	addr.can_family = AF_CAN;
	addr.can_ifindex = if_nametoindex(argv[2]);
	if (!addr.can_ifindex) {
		perror("if_nametoindex");
		return 1;
	}

	/* disable reception of CAN frames until we are opened by 'O' */
	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, NULL, 0);

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind");
		return 1;
	}

	/* open filter by default */
	fi.can_id = 0;
	fi.can_mask = 0;

	while (running) {
		FD_ZERO(&rdfs);

		if (select_stdin)
			FD_SET(0, &rdfs);

		FD_SET(p, &rdfs);
		FD_SET(s, &rdfs);

		if (select(s + 1, &rdfs, NULL, NULL, NULL) < 0) {
			perror("select");
			return 1;
		}

		if (FD_ISSET(0, &rdfs)) {
			running = 0;
			continue;
		}

		if (FD_ISSET(p, &rdfs))
			if (pty2can(p, s, &fi, &is_open, &tstamp)) {
				running = 0;
				continue;
			}

		if (FD_ISSET(s, &rdfs))
			if (can2pty(p, s, &tstamp)) {
				running = 0;
				continue;
			}
	}

	close(p);
	close(s);

	return 0;
}